

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O2

SubroutineSymbol * __thiscall
slang::ast::MethodPrototypeSymbol::getSubroutine(MethodPrototypeSymbol *this)

{
  optional<const_slang::ast::SubroutineSymbol_*> *this_00;
  SyntaxKind SVar1;
  Scope *pSVar2;
  Symbol *pSVar3;
  Scope *scope;
  Compilation *this_01;
  bool bVar4;
  SubroutineSymbol **ppSVar5;
  SourceLocation location;
  Diagnostic *pDVar6;
  Diagnostic *this_02;
  SubroutineSymbol *pSVar7;
  _Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false> syntax;
  SourceRange sourceRange;
  tuple<const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*> local_58;
  Token local_40;
  
  this_00 = &this->subroutine;
  if ((this->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged ==
      true) {
    if (this->needsMatchCheck == true) {
      this->needsMatchCheck = false;
      pSVar2 = (this->super_Symbol).parentScope;
      ppSVar5 = std::optional<const_slang::ast::SubroutineSymbol_*>::value(this_00);
      bVar4 = checkMethodMatch(this,pSVar2,*ppSVar5);
      if (!bVar4) {
        if ((this->subroutine).
            super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>._M_payload.
            super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged == false)
        {
          (this->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
          _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged =
               true;
        }
        (this_00->super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>)._M_payload
        .super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_payload._M_value =
             (SubroutineSymbol *)0x0;
      }
    }
    return (this_00->super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>).
           _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_payload.
           _M_value;
  }
  (this->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
  _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged = true;
  (this->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
  _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_payload._M_value
       = (SubroutineSymbol *)0x0;
  if ((this->super_Symbol).name._M_len == 0) {
LAB_003b313e:
    pSVar7 = (SubroutineSymbol *)0x0;
  }
  else {
    pSVar2 = (this->super_Symbol).parentScope;
    pSVar3 = pSVar2->thisSym;
    scope = pSVar3->parentScope;
    this_01 = scope->compilation;
    Compilation::findOutOfBlockDecl(&local_58,this_01,scope,pSVar3->name,(this->super_Symbol).name);
    if (((FunctionDeclarationSyntax *)
         local_58.
         super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>.
         super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl ==
         (FunctionDeclarationSyntax *)0x0) ||
       ((SVar1 = (((MemberSyntax *)
                  &(local_58.
                    super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                    .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl)->
                   kind)->super_SyntaxNode).kind, SVar1 != TaskDeclaration &&
        (SVar1 != FunctionDeclaration)))) {
      syntax._M_head_impl = (SyntaxNode *)0x0;
    }
    else {
      *(bool *)local_58.
               super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
               .super__Tuple_impl<1UL,_slang::ast::SymbolIndex,_bool_*>.
               super__Tuple_impl<2UL,_bool_*>.super__Head_base<2UL,_bool_*,_false>._M_head_impl =
           true;
      syntax._M_head_impl =
           local_58.
           super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
           .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl;
    }
    if (((this->flags).m_bits & 2) == 0) {
      if ((FunctionDeclarationSyntax *)syntax._M_head_impl == (FunctionDeclarationSyntax *)0x0) {
        pDVar6 = Scope::addDiag(scope,(DiagCode)0x8b0006,(this->super_Symbol).location);
        Diagnostic::operator<<(pDVar6,(this->super_Symbol).name);
        goto LAB_003b313e;
      }
      if (local_58.
          super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
          .super__Tuple_impl<1UL,_slang::ast::SymbolIndex,_bool_*>.
          super__Head_base<1UL,_slang::ast::SymbolIndex,_false>._M_head_impl <= pSVar3->indexInScope
         ) {
        local_40 = slang::syntax::SyntaxNode::getLastToken
                             ((SyntaxNode *)
                              (((((FunctionDeclarationSyntax *)syntax._M_head_impl)->prototype).ptr)
                              ->name).ptr);
        location = parsing::Token::location(&local_40);
        pDVar6 = Scope::addDiag(scope,(DiagCode)0x6e0006,location);
        this_02 = Diagnostic::operator<<(pDVar6,(this->super_Symbol).name);
        Diagnostic::operator<<(this_02,pSVar3->name);
        Diagnostic::addNote(pDVar6,(DiagCode)0x50001,pSVar3->location);
      }
      pSVar7 = SubroutineSymbol::createOutOfBlock
                         (this_01,(FunctionDeclarationSyntax *)syntax._M_head_impl,this,pSVar2,scope
                          ,local_58.
                           super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                           .super__Tuple_impl<1UL,_slang::ast::SymbolIndex,_bool_*>.
                           super__Head_base<1UL,_slang::ast::SymbolIndex,_false>._M_head_impl);
    }
    else {
      if ((FunctionDeclarationSyntax *)syntax._M_head_impl != (FunctionDeclarationSyntax *)0x0) {
        sourceRange = slang::syntax::SyntaxNode::sourceRange
                                ((SyntaxNode *)
                                 (((((FunctionDeclarationSyntax *)syntax._M_head_impl)->prototype).
                                  ptr)->name).ptr);
        pDVar6 = Scope::addDiag(scope,(DiagCode)0xc0006,sourceRange);
        Diagnostic::addNote(pDVar6,(DiagCode)0x50001,(this->super_Symbol).location);
        return (this->subroutine).
               super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>._M_payload.
               super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_payload.
               _M_value;
      }
      pSVar7 = SubroutineSymbol::createFromPrototype(this_01,this,pSVar2);
    }
    if ((this->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
        _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged ==
        false) {
      (this->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged =
           true;
    }
    (this_00->super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>)._M_payload.
    super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_payload._M_value = pSVar7;
  }
  return pSVar7;
}

Assistant:

const SubroutineSymbol* MethodPrototypeSymbol::getSubroutine() const {
    SLANG_ASSERT(getParentScope() && getParentScope()->asSymbol().getParentScope());

    if (subroutine) {
        if (needsMatchCheck) {
            needsMatchCheck = false;
            if (!checkMethodMatch(*getParentScope(), *subroutine.value()))
                subroutine = nullptr;
        }
        return *subroutine;
    }

    subroutine = nullptr;
    if (name.empty())
        return *subroutine;

    auto& nearScope = *getParentScope();
    auto& parentSym = nearScope.asSymbol();
    auto& outerScope = *parentSym.getParentScope();
    auto& comp = outerScope.getCompilation();

    SLANG_ASSERT(!flags.has(MethodFlags::ModportImport | MethodFlags::ModportExport |
                            MethodFlags::InterfaceExtern));

    // The out-of-block definition must be in our parent scope.
    auto [declSyntax, index, used] = comp.findOutOfBlockDecl(outerScope, parentSym.name, name);
    const FunctionDeclarationSyntax* syntax = nullptr;
    if (declSyntax && (declSyntax->kind == SyntaxKind::FunctionDeclaration ||
                       declSyntax->kind == SyntaxKind::TaskDeclaration)) {
        syntax = &declSyntax->as<FunctionDeclarationSyntax>();
        *used = true;
    }

    if (flags.has(MethodFlags::Pure)) {
        // A pure method should not have a body defined.
        if (syntax) {
            auto& diag = outerScope.addDiag(diag::BodyForPure,
                                            syntax->prototype->name->sourceRange());
            diag.addNote(diag::NoteDeclarationHere, location);
        }
        else {
            // Create a stub subroutine that we can return for callers to reference.
            subroutine = &SubroutineSymbol::createFromPrototype(comp, *this, nearScope);
        }
        return *subroutine;
    }

    // Otherwise, there must be a body for any declared prototype.
    if (!syntax) {
        outerScope.addDiag(diag::NoMemberImplFound, location) << name;
        return nullptr;
    }

    // The method definition must be located after the class definition.
    if (index <= parentSym.getIndex()) {
        auto& diag = outerScope.addDiag(diag::MemberDefinitionBeforeClass,
                                        syntax->prototype->name->getLastToken().location());
        diag << name << parentSym.name;
        diag.addNote(diag::NoteDeclarationHere, parentSym.location);
    }

    subroutine = &SubroutineSymbol::createOutOfBlock(comp, *syntax, *this, nearScope, outerScope,
                                                     index);
    return *subroutine;
}